

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.cpp
# Opt level: O2

MPP_RET mpp_check_support_format(MppCtxType type,MppCodingType coding)

{
  long lVar1;
  
  lVar1 = 4;
  while( true ) {
    if (lVar1 == 0x184) {
      return MPP_NOK;
    }
    if ((*(MppCtxType *)((long)Mpp::set_io_mode::iomode_2str + lVar1 + 0xc) == type) &&
       (*(MppCodingType *)((long)&support_list[0].type + lVar1) == coding)) break;
    lVar1 = lVar1 + 0x18;
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_check_support_format(MppCtxType type, MppCodingType coding)
{
    MPP_RET ret = MPP_NOK;
    RK_U32 i = 0;

    for (i = 0; i < MPP_ARRAY_ELEMS(support_list); i++) {
        MppCodingTypeInfo *info = &support_list[i];
        if (type    == info->type &&
            coding  == info->coding) {
            ret = MPP_OK;
            break;
        }
    }
    return ret;
}